

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O0

Vec_Que_t * Vec_QueAlloc(int nCap)

{
  Vec_Que_t *pVVar1;
  int *piVar2;
  Vec_Que_t *p;
  int nCap_local;
  
  pVVar1 = (Vec_Que_t *)calloc(1,0x20);
  p._4_4_ = nCap;
  if (nCap < 0x10) {
    p._4_4_ = 0x10;
  }
  pVVar1->nSize = 1;
  pVVar1->nCap = p._4_4_ + 1;
  piVar2 = (int *)malloc((long)pVVar1->nCap << 2);
  memset(piVar2,0xff,(long)pVVar1->nCap << 2);
  pVVar1->pHeap = piVar2;
  piVar2 = (int *)malloc((long)pVVar1->nCap << 2);
  memset(piVar2,0xff,(long)pVVar1->nCap << 2);
  pVVar1->pOrder = piVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Que_t * Vec_QueAlloc( int nCap )
{
    Vec_Que_t * p;
    p = ABC_CALLOC( Vec_Que_t, 1 );
    if ( nCap < 16 )
        nCap = 16;
    p->nSize  = 1;
    p->nCap   = nCap + 1;
    p->pHeap  = ABC_FALLOC( int, p->nCap );
    p->pOrder = ABC_FALLOC( int, p->nCap );
    return p;
}